

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

hugeint_t __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,duckdb::hugeint_t,duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>,duckdb::QuantileIndirect<duckdb::hugeint_t>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
          *accessor)

{
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>_>
  __comp;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>_>
  __comp_00;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>_>
  __comp_01;
  QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
  *in_RCX;
  hugeint_t *in_RDI;
  RESULT_TYPE RVar1;
  hugeint_t hVar2;
  hugeint_t hi;
  hugeint_t lo;
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>_>
  comp;
  hugeint_t *hi_00;
  unsigned_long *in_stack_ffffffffffffff60;
  unsigned_long *in_stack_ffffffffffffff68;
  unsigned_long *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
  *pQVar3;
  undefined8 in_stack_ffffffffffffff88;
  Vector *pVVar4;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 local_48 [56];
  hugeint_t local_10;
  
  QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>_>
  ::QuantileCompare((QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>_>
                     *)local_48,in_RCX,(bool)(*(byte *)&in_RDI->lower & 1));
  if ((QuantileIndirect<duckdb::hugeint_t> *)in_RDI[1].upper ==
      (QuantileIndirect<duckdb::hugeint_t> *)in_RDI[1].lower) {
    __comp.accessor_r =
         (QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
          *)in_stack_ffffffffffffff88;
    __comp.accessor_l =
         (QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
          *)in_stack_ffffffffffffff80;
    __comp._16_8_ = in_stack_ffffffffffffff90;
    ::std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>,duckdb::QuantileIndirect<duckdb::hugeint_t>>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__comp)
    ;
    QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
    ::operator()((QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
                  *)in_RDI,(idx_t *)local_48._16_8_);
    local_10 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
                         (in_RDI,(Vector *)local_48._16_8_);
  }
  else {
    __comp_00.accessor_r =
         (QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
          *)local_48._16_8_;
    __comp_00.accessor_l =
         (QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
          *)local_48._8_8_;
    __comp_00._16_8_ = in_stack_ffffffffffffff90;
    pQVar3 = (QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
              *)local_48._8_8_;
    pVVar4 = (Vector *)local_48._16_8_;
    ::std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>,duckdb::QuantileIndirect<duckdb::hugeint_t>>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               __comp_00);
    __comp_01.accessor_r =
         (QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
          *)pVVar4;
    __comp_01.accessor_l = pQVar3;
    __comp_01._16_8_ = in_stack_ffffffffffffff90;
    ::std::
    nth_element<unsigned_long*,duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>,duckdb::QuantileIndirect<duckdb::hugeint_t>>>>
              (in_stack_ffffffffffffff70,(unsigned_long *)local_48._16_8_,
               (unsigned_long *)local_48._8_8_,__comp_01);
    RVar1 = QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
            ::operator()((QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
                          *)in_RDI,(idx_t *)local_48._16_8_);
    hi_00 = (hugeint_t *)RVar1.upper;
    hVar2 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
                      (in_RDI,(Vector *)local_48._16_8_);
    QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
    ::operator()((QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
                  *)in_RDI,(idx_t *)local_48._16_8_);
    CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>(in_RDI,(Vector *)local_48._16_8_);
    local_10 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                         ((hugeint_t *)hVar2.upper,(double)hVar2.lower,hi_00);
  }
  return local_10;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}